

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::TrySimpleIntegerCast<short,true>(char *buf,idx_t len,short *result,bool strict)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  byte bVar11;
  short sVar12;
  int iVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  IntegerCastData<short> local_5c;
  IntegerCastData<short> local_5a;
  IntegerDecimalCastData<short> local_58;
  ulong local_40;
  ulong local_38;
  
  if (len != 0) {
    uVar4 = 0;
    do {
      bVar2 = buf[uVar4];
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        local_5c.result = 0;
        if (bVar2 == 0x2d) {
          bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (buf + uVar4,len - uVar4,&local_5c,SUB81(uVar4,0));
          goto LAB_01517176;
        }
        if (bVar2 == 0x30 && len - 1 != uVar4) {
          bVar2 = buf[uVar4 + 1];
          if (bVar2 < 0x62) {
            if (bVar2 == 0x42) {
LAB_015172c0:
              uVar5 = ~uVar4 + len;
              bVar1 = uVar5 >= 2;
              if (uVar5 < 2) goto LAB_01517176;
              uVar8 = 1;
              local_5c.result = 0;
              goto LAB_015172e2;
            }
            if (bVar2 == 0x58) {
LAB_0151719b:
              iVar13 = 0;
              iVar7 = 0;
              uVar5 = 1;
              goto LAB_015171bb;
            }
          }
          else {
            if (bVar2 == 0x62) goto LAB_015172c0;
            if (bVar2 == 0x78) goto LAB_0151719b;
          }
        }
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (buf + uVar4,len - uVar4,&local_5c,SUB81(uVar4,0));
        goto LAB_01517176;
      }
      uVar4 = uVar4 + 1;
    } while (len != uVar4);
    goto LAB_01517378;
  }
  goto LAB_01517bac;
LAB_015171bb:
  do {
    local_5c.result = (ResultType_conflict)iVar13;
    if (~uVar4 + len <= uVar5) {
      bVar1 = 1 < uVar5;
LAB_01517176:
      if (bVar1 != false) goto LAB_0151717e;
      break;
    }
    bVar2 = buf[uVar4 + 1 + uVar5];
    bVar11 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar11 = bVar2;
    }
    if ((9 < (byte)(bVar11 - 0x30)) &&
       ((0x25 < bVar11 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar11 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar15 = -0x57;
    if ((char)bVar11 < 'a') {
      cVar15 = -0x30;
    }
    uVar8 = uVar5 + 1;
    if (((len - uVar5) - 2 == uVar4) || (buf[uVar4 + 2 + uVar5] != '_')) {
LAB_01517278:
      bVar1 = (int)(short)iVar7 <= (int)((byte)(cVar15 + bVar11) >> 4 ^ 0x7ff);
      if (bVar1) {
        iVar13 = (short)iVar7 * 0x10 + (uint)(byte)(cVar15 + bVar11);
        iVar7 = iVar13;
      }
    }
    else {
      uVar8 = uVar5 + 2;
      if ((len - uVar5) - 3 != uVar4) {
        if (9 < (byte)(buf[uVar4 + 3 + uVar5] - 0x30U)) {
          bVar1 = false;
          uVar16 = (byte)buf[uVar4 + 3 + uVar5] - 0x41;
          if ((0x25 < uVar16) || ((0x3f0000003fU >> ((ulong)uVar16 & 0x3f) & 1) == 0))
          goto LAB_015172ad;
        }
        goto LAB_01517278;
      }
      bVar1 = false;
    }
LAB_015172ad:
    local_5c.result = (ResultType_conflict)iVar13;
    uVar5 = uVar8;
  } while (bVar1);
LAB_01517378:
  if (len != 0) {
    uVar4 = 0;
    do {
      bVar2 = buf[uVar4];
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        local_58.result = 0;
        local_58.decimal = 0;
        local_58._16_8_ = 0;
        uVar5 = len - uVar4;
        bVar1 = SUB81(uVar5,0);
        local_58.decimal_digits = 0;
        if (bVar2 == 0x2d) {
          uVar8 = 1;
          local_58.result = 0;
          goto LAB_015173e1;
        }
        if (bVar2 == 0x30 && len - 1 != uVar4) {
          bVar11 = buf[uVar4 + 1];
          if (bVar11 < 0x62) {
            if (bVar11 == 0x42) {
LAB_015177b8:
              uVar5 = ~uVar4 + len;
              if (uVar5 < 2) goto LAB_01517860;
              uVar8 = 1;
              local_58.result = 0;
              goto LAB_015177df;
            }
            if (bVar11 == 0x58) {
LAB_01517673:
              local_58.result = 0;
              uVar5 = 1;
              goto LAB_0151769b;
            }
          }
          else {
            if (bVar11 == 0x62) goto LAB_015177b8;
            if (bVar11 == 0x78) goto LAB_01517673;
          }
        }
        uVar9 = (ulong)(bVar2 == 0x2b);
        local_58.result = 0;
        uVar8 = uVar9;
        goto LAB_015174dc;
      }
      uVar4 = uVar4 + 1;
    } while (len != uVar4);
  }
  goto LAB_01517bac;
  while( true ) {
    bVar2 = buf[uVar4 + uVar8] - 0x30;
    if (9 < bVar2) {
      if (buf[uVar4 + uVar8] != '.') goto LAB_015179af;
      uVar9 = uVar8 + 1;
      iVar7 = 3;
      uVar14 = uVar9;
      if (uVar5 <= uVar9) goto LAB_01517984;
      local_58.decimal = 0;
      goto LAB_015175d7;
    }
    uVar9 = uVar8 + 1;
    if (local_58.result < (long)((ulong)bVar2 + 0x8000000000000000) / 10) {
      bVar19 = false;
    }
    else {
      local_58.result = local_58.result * 10 - (ulong)bVar2;
      bVar19 = true;
      if ((~uVar8 + len != uVar4) && (buf[uVar4 + 1 + uVar8] == '_')) {
        uVar9 = uVar8 + 2;
        if ((len - uVar8) - 2 == uVar4) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar4 + uVar9] - 0x30U) < 10;
        }
      }
    }
    uVar8 = uVar9;
    if (!bVar19) break;
LAB_015173e1:
    if (uVar5 <= uVar8) goto LAB_01517585;
  }
  goto LAB_01517bac;
  while (uVar14 = uVar17, uVar17 < uVar5) {
LAB_015175d7:
    bVar2 = buf[uVar4 + uVar14] - 0x30;
    local_40 = uVar9;
    if (9 < bVar2) {
      iVar7 = 0;
      goto LAB_01517975;
    }
    if (local_58.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_58.decimal_digits = local_58.decimal_digits + 1;
      local_58.decimal = (ulong)bVar2 + local_58.decimal * 10;
    }
    uVar17 = uVar14 + 1;
    if (((~uVar14 + len != uVar4) && (buf[uVar4 + 1 + uVar14] == '_')) &&
       ((uVar17 = uVar14 + 2, (len - uVar14) - 2 == uVar4 ||
        (9 < (byte)(buf[uVar4 + uVar17] - 0x30U))))) {
      local_58._18_6_ = 0;
      uVar14 = uVar17;
      iVar13 = 1;
      goto LAB_0151799c;
    }
  }
  iVar7 = 3;
LAB_01517975:
  local_58._18_6_ = 0;
LAB_01517984:
  iVar13 = 1;
  if (uVar9 < uVar14) {
    iVar13 = iVar7;
  }
  if (1 < uVar8) {
    iVar13 = iVar7;
  }
LAB_0151799c:
  uVar8 = uVar14;
  if (iVar13 != 3) {
    if (iVar13 != 0) goto LAB_01517bac;
LAB_015179af:
    bVar2 = buf[uVar4 + uVar8];
    bVar19 = false;
    uVar16 = (uint)bVar2;
    if (bVar2 < 0x20) {
      bVar19 = false;
      if (4 < uVar16 - 9) goto LAB_01517bae;
    }
    else {
      if ((bVar2 == 0x65) || (uVar16 == 0x45)) {
        if ((uVar8 != 1) && (uVar8 + 1 < uVar5)) {
          local_5a.result = 0;
          pcVar10 = buf + uVar4 + uVar8 + 1;
          iVar6 = ~uVar4 + (len - uVar8);
          if (*pcVar10 == '-') {
            bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar10,iVar6,&local_5a,bVar1);
          }
          else {
            bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar10,iVar6,&local_5a,bVar1);
          }
          if (bVar1 != false) {
            bVar19 = IntegerDecimalCastOperation::
                     HandleExponent<duckdb::IntegerDecimalCastData<short>,true>
                               (&local_58,local_5a.result);
            goto LAB_01517bae;
          }
        }
        goto LAB_01517bac;
      }
      if (uVar16 != 0x20) goto LAB_01517bae;
    }
    uVar9 = uVar8 + 1;
    uVar8 = uVar9;
    if (uVar9 < uVar5) {
      do {
        if ((4 < (byte)buf[uVar4 + uVar9] - 9) && (buf[uVar4 + uVar9] != 0x20)) goto LAB_01517bac;
        uVar9 = uVar9 + 1;
        uVar8 = uVar5;
      } while (uVar5 != uVar9);
    }
  }
LAB_01517585:
  bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                    (&local_58);
  if (bVar1) {
    bVar19 = 1 < uVar8;
    goto LAB_01517bae;
  }
  goto LAB_01517bac;
  while( true ) {
    uVar9 = uVar8 + 1;
    if (((len - uVar8) - 2 != uVar4) && (buf[uVar4 + 2 + uVar8] == '_')) {
      if (((len - uVar8) - 3 == uVar4) || ((buf[uVar4 + 3 + uVar8] & 0xfeU) != 0x30))
      goto LAB_01517bac;
      uVar9 = uVar8 + 2;
    }
    uVar8 = uVar9;
    if (0x3fffffffffffffff < local_58.result) goto LAB_01517bac;
    local_58.result = lVar3 + local_58.result * 2;
    if (uVar5 <= uVar8) break;
LAB_015177df:
    if (buf[uVar4 + 1 + uVar8] == '0') {
      lVar3 = 0;
    }
    else {
      if (buf[uVar4 + 1 + uVar8] != '1') goto LAB_01517bac;
      lVar3 = 1;
    }
  }
LAB_01517860:
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                     (&local_58);
  bVar19 = bVar19 && 1 < uVar5;
  goto LAB_01517bae;
LAB_0151769b:
  do {
    if (~uVar4 + len <= uVar5) {
      bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                         (&local_58);
      bVar19 = 1 < uVar5 && bVar19;
      goto LAB_01517bae;
    }
    bVar2 = buf[uVar4 + 1 + uVar5];
    bVar11 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar11 = bVar2;
    }
    if ((9 < (byte)(bVar11 - 0x30)) &&
       ((0x25 < bVar11 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar11 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar15 = -0x57;
    if ((char)bVar11 < 'a') {
      cVar15 = -0x30;
    }
    uVar8 = uVar5 + 1;
    if (((len - uVar5) - 2 == uVar4) || (buf[uVar4 + 2 + uVar5] != '_')) {
LAB_01517759:
      uVar5 = (ulong)((byte)(cVar15 + bVar11) >> 4) ^ 0x7ffffffffffffff;
      lVar3 = local_58.result;
      if (local_58.result <= (long)uVar5) {
        lVar3 = local_58.result * 0x10 + (ulong)(byte)(cVar15 + bVar11);
      }
      bVar1 = local_58.result <= (long)uVar5;
      local_58.result = lVar3;
    }
    else {
      uVar8 = uVar5 + 2;
      if ((len - uVar5) - 3 != uVar4) {
        if (9 < (byte)(buf[uVar4 + 3 + uVar5] - 0x30U)) {
          uVar16 = (byte)buf[uVar4 + 3 + uVar5] - 0x41;
          bVar1 = false;
          if ((0x25 < uVar16) || (bVar1 = false, (0x3f0000003fU >> ((ulong)uVar16 & 0x3f) & 1) == 0)
             ) goto LAB_01517780;
        }
        goto LAB_01517759;
      }
      bVar1 = false;
    }
LAB_01517780:
    uVar5 = uVar8;
  } while (bVar1);
  goto LAB_01517bac;
  while( true ) {
    bVar2 = buf[uVar4 + uVar8] - 0x30;
    if (9 < bVar2) {
      if (buf[uVar4 + uVar8] != '.') goto LAB_01517a9b;
      uVar14 = uVar8 + 1;
      iVar7 = 3;
      uVar17 = uVar14;
      if (uVar5 <= uVar14) goto LAB_01517a76;
      local_58.decimal = 0;
      goto LAB_015178b3;
    }
    uVar14 = uVar8 + 1;
    if ((long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10) < local_58.result) {
      bVar19 = false;
    }
    else {
      local_58.result = local_58.result * 10 + (ulong)bVar2;
      bVar19 = true;
      if ((~uVar8 + len != uVar4) && (buf[uVar4 + 1 + uVar8] == '_')) {
        uVar14 = uVar8 + 2;
        if ((len - uVar8) - 2 == uVar4) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar4 + uVar14] - 0x30U) < 10;
        }
      }
    }
    uVar8 = uVar14;
    if (!bVar19) break;
LAB_015174dc:
    if (uVar5 <= uVar8) goto LAB_0151779b;
  }
  goto LAB_01517bac;
  while( true ) {
    uVar9 = uVar8 + 1;
    if (((len - uVar8) - 2 != uVar4) && (buf[uVar4 + 2 + uVar8] == '_')) {
      if (((len - uVar8) - 3 == uVar4) || ((buf[uVar4 + 3 + uVar8] & 0xfeU) != 0x30))
      goto LAB_01517378;
      uVar9 = uVar8 + 2;
    }
    uVar8 = uVar9;
    if (0x3fff < local_5c.result) goto LAB_01517378;
    local_5c.result = sVar12 + local_5c.result * 2;
    if (uVar5 <= uVar8) break;
LAB_015172e2:
    if (buf[uVar4 + 1 + uVar8] == '0') {
      sVar12 = 0;
    }
    else {
      if (buf[uVar4 + 1 + uVar8] != '1') goto LAB_01517378;
      sVar12 = 1;
    }
  }
LAB_0151717e:
  *result = local_5c.result;
  return true;
  while (uVar17 = uVar18, uVar18 < uVar5) {
LAB_015178b3:
    bVar2 = buf[uVar4 + uVar17] - 0x30;
    local_40 = uVar9;
    local_38 = uVar14;
    if (9 < bVar2) {
      iVar7 = 0;
      goto LAB_01517a62;
    }
    if (local_58.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_58.decimal_digits = local_58.decimal_digits + 1;
      local_58.decimal = (ulong)bVar2 + local_58.decimal * 10;
    }
    uVar18 = uVar17 + 1;
    if (((~uVar17 + len != uVar4) && (buf[uVar4 + 1 + uVar17] == '_')) &&
       ((uVar18 = uVar17 + 2, (len - uVar17) - 2 == uVar4 ||
        (9 < (byte)(buf[uVar4 + uVar18] - 0x30U))))) {
      local_58._18_6_ = 0;
      uVar17 = uVar18;
      iVar13 = 1;
      goto LAB_01517a8a;
    }
  }
  iVar7 = 3;
LAB_01517a62:
  local_58._18_6_ = 0;
LAB_01517a76:
  iVar13 = 1;
  if (uVar14 < uVar17) {
    iVar13 = iVar7;
  }
  if (uVar9 < uVar8) {
    iVar13 = iVar7;
  }
LAB_01517a8a:
  uVar8 = uVar17;
  if (iVar13 != 3) {
    if (iVar13 != 0) goto LAB_01517bac;
LAB_01517a9b:
    bVar2 = buf[uVar4 + uVar8];
    bVar19 = false;
    uVar16 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar16 - 9) goto LAB_01517bae;
    }
    else {
      if ((bVar2 == 0x65) || (uVar16 == 0x45)) {
        if ((uVar8 != uVar9) && (uVar8 + 1 < uVar5)) {
          local_5a.result = 0;
          pcVar10 = buf + uVar4 + uVar8 + 1;
          iVar6 = ~uVar4 + (len - uVar8);
          if (*pcVar10 == '-') {
            bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar10,iVar6,&local_5a,bVar1);
          }
          else {
            bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar10,iVar6,&local_5a,bVar1);
          }
          if (bVar1 != false) {
            bVar19 = IntegerDecimalCastOperation::
                     HandleExponent<duckdb::IntegerDecimalCastData<short>,false>
                               (&local_58,local_5a.result);
            goto LAB_01517bae;
          }
        }
        goto LAB_01517bac;
      }
      if (uVar16 != 0x20) goto LAB_01517bae;
    }
    uVar14 = uVar8 + 1;
    uVar8 = uVar14;
    if (uVar14 < uVar5) {
      do {
        if ((4 < (byte)buf[uVar4 + uVar14] - 9) && (buf[uVar4 + uVar14] != 0x20)) goto LAB_01517bac;
        uVar14 = uVar14 + 1;
        uVar8 = uVar5;
      } while (uVar5 != uVar14);
    }
  }
LAB_0151779b:
  bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    (&local_58);
  if (bVar1) {
    bVar19 = uVar9 < uVar8;
    goto LAB_01517bae;
  }
LAB_01517bac:
  bVar19 = false;
LAB_01517bae:
  if (bVar19 != false) {
    *result = (short)local_58.result;
  }
  return bVar19;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}